

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O2

sat_iterator
pstore::storage::slice_region_into_segments
          (shared_ptr<pstore::memory_mapper_base> *region,sat_iterator segment_it,
          sat_iterator segment_end)

{
  sat_iterator this;
  element_type *peVar1;
  element_type *peVar2;
  __shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<void> data;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_58;
  sat_iterator local_48;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_48 = segment_end;
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(((region->super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr)->ptr_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
  std::static_pointer_cast<unsigned_char,void>((shared_ptr<void> *)&local_58);
  peVar1 = local_58._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  peVar2 = (element_type *)
           (((region->super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->size_ + (long)peVar1);
  this_00 = &(segment_it->region).
             super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>;
  while( true ) {
    this = (sat_iterator)(this_00 + -1);
    if (peVar2 <= peVar1) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      return this;
    }
    if (this == local_48) break;
    if (((this->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) || (this_00->_M_ptr != (element_type *)0x0)) {
      assert_failed("segment.value == nullptr && segment.region == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0xb0);
    }
    local_58._M_ptr = peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
              (&local_58._M_refcount,&local_40._M_refcount);
    std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)this,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&region->
                        super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>);
    peVar1 = (element_type *)((long)peVar1 + 0x400000);
    this_00 = this_00 + 2;
  }
  assert_failed("segment_it != segment_end",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                ,0xae);
}

Assistant:

auto storage::slice_region_into_segments (std::shared_ptr<memory_mapper_base> const & region,
                                              sat_iterator segment_it,
                                              sat_iterator const segment_end) -> sat_iterator {

        (void) segment_end; // silence unused argument warning in release build.
        std::shared_ptr<void> const data = region->data ();

        auto ptr = std::static_pointer_cast<std::uint8_t> (data).get ();
        auto const end = ptr + region->size ();
        for (; ptr < end; ptr += address::segment_size) {
            PSTORE_ASSERT (segment_it != segment_end);
            sat_entry & segment = *segment_it;
            PSTORE_ASSERT (segment.value == nullptr && segment.region == nullptr);

            // The segment's memory (at 'ptr') is managed by the 'data' shared_ptr.
            segment.value = std::shared_ptr<void> (data, ptr);
            segment.region = region;

            ++segment_it;
        }
        return segment_it;
    }